

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O2

LinkedTag __thiscall LinkedReadsDatastore::get_read_tag(LinkedReadsDatastore *this,size_t readID)

{
  pointer puVar1;
  LinkedTag LVar2;
  
  LVar2 = 0;
  if ((readID != 0) &&
     (puVar1 = (this->read_tag).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start, LVar2 = 0,
     readID <= (ulong)((long)(this->read_tag).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish - (long)puVar1 >> 1))) {
    LVar2 = *(LinkedTag *)((long)puVar1 + (readID * 2 - 2 & 0xfffffffffffffffc));
  }
  return LVar2;
}

Assistant:

LinkedTag LinkedReadsDatastore::get_read_tag(size_t readID) {
    if (readID==0 or readID>size()) return 0;
    return read_tag[(readID-1)/2];
}